

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::Clear(X3DImporter *this)

{
  bool bVar1;
  reference ppCVar2;
  _Self local_20;
  _Self local_18;
  iterator it;
  X3DImporter *this_local;
  
  this->NodeElement_Cur = (CX3DImporter_NodeElement *)0x0;
  it._M_node = (_List_node_base *)this;
  bVar1 = std::__cxx11::
          list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::empty
                    (&this->NodeElement_List);
  if (!bVar1) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
         ::begin(&this->NodeElement_List);
    while( true ) {
      local_20._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::end
                     (&this->NodeElement_List);
      bVar1 = std::operator!=(&local_18,&local_20);
      if (!bVar1) break;
      ppCVar2 = std::_List_iterator<CX3DImporter_NodeElement_*>::operator*(&local_18);
      if (*ppCVar2 != (CX3DImporter_NodeElement *)0x0) {
        (*(*ppCVar2)->_vptr_CX3DImporter_NodeElement[1])();
      }
      std::_List_iterator<CX3DImporter_NodeElement_*>::operator++(&local_18);
    }
    std::__cxx11::list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
    clear(&this->NodeElement_List);
  }
  return;
}

Assistant:

void X3DImporter::Clear() {
	NodeElement_Cur = nullptr;
	// Delete all elements
	if(!NodeElement_List.empty()) {
        for ( std::list<CX3DImporter_NodeElement*>::iterator it = NodeElement_List.begin(); it != NodeElement_List.end(); ++it ) {
            delete *it;
        }
		NodeElement_List.clear();
	}
}